

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MemPass::DCEInst
          (MemPass *this,Instruction *inst,function<void_(spvtools::opt::Instruction_*)> *call_back)

{
  size_t this_00;
  bool bVar1;
  Op OVar2;
  reference ppIVar3;
  IRContext *pIVar4;
  reference puVar5;
  DefUseManager *this_01;
  Instruction *local_100;
  Instruction *odi;
  iterator iStack_f0;
  uint id;
  iterator __end3;
  iterator __begin3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range3;
  anon_class_8_1_ba1d5218 aStack_d0;
  uint32_t varId;
  function<void_(unsigned_int_*)> local_c8;
  undefined1 local_a8 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> ids;
  Instruction *di;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  deadInsts;
  function<void_(spvtools::opt::Instruction_*)> *call_back_local;
  Instruction *inst_local;
  MemPass *this_local;
  
  deadInsts.c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)call_back;
  call_back_local = (function<void_(spvtools::opt::Instruction_*)> *)inst;
  inst_local = (Instruction *)this;
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            ((queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
              *)&di);
  std::
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  ::push((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          *)&di,(value_type *)&call_back_local);
  while (bVar1 = std::
                 queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::empty((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          *)&di), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar3 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::front((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                       *)&di);
    ids._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppIVar3;
    OVar2 = opt::Instruction::opcode
                      ((Instruction *)ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (OVar2 == OpLabel) {
      std::
      queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::pop((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
             *)&di);
    }
    else {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_a8);
      this_00 = ids._M_t._M_impl.super__Rb_tree_header._M_node_count;
      aStack_d0.ids =
           (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_a8;
      std::function<void(unsigned_int*)>::
      function<spvtools::opt::MemPass::DCEInst(spvtools::opt::Instruction*,std::function<void(spvtools::opt::Instruction*)>const&)::__0,void>
                ((function<void(unsigned_int*)> *)&local_c8,&stack0xffffffffffffff30);
      opt::Instruction::ForEachInId((Instruction *)this_00,&local_c8);
      std::function<void_(unsigned_int_*)>::~function(&local_c8);
      __range3._4_4_ = 0;
      OVar2 = opt::Instruction::opcode
                        ((Instruction *)ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (OVar2 == OpLoad) {
        GetPtr(this,(Instruction *)ids._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (uint32_t *)((long)&__range3 + 4));
      }
      bVar1 = std::function::operator_cast_to_bool
                        ((function *)
                         deadInsts.c.
                         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
      if (bVar1) {
        std::function<void_(spvtools::opt::Instruction_*)>::operator()
                  ((function<void_(spvtools::opt::Instruction_*)> *)
                   deadInsts.c.
                   super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
                   (Instruction *)ids._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      pIVar4 = Pass::context(&this->super_Pass);
      IRContext::KillInst(pIVar4,(Instruction *)ids._M_t._M_impl.super__Rb_tree_header._M_node_count
                         );
      __end3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_a8);
      iStack_f0 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      local_a8);
      while (bVar1 = std::operator!=(&__end3,&stack0xffffffffffffff10), bVar1) {
        puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end3);
        odi._4_4_ = *puVar5;
        bVar1 = HasOnlyNamesAndDecorates(this,odi._4_4_);
        if (bVar1) {
          this_01 = Pass::get_def_use_mgr(&this->super_Pass);
          local_100 = analysis::DefUseManager::GetDef(this_01,odi._4_4_);
          pIVar4 = Pass::context(&this->super_Pass);
          bVar1 = IRContext::IsCombinatorInstruction(pIVar4,local_100);
          if (bVar1) {
            std::
            queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            ::push((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                    *)&di,&local_100);
          }
        }
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end3);
      }
      if ((__range3._4_4_ != 0) && (bVar1 = IsLiveVar(this,__range3._4_4_), !bVar1)) {
        AddStores(this,__range3._4_4_,
                  (queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                   *)&di);
      }
      std::
      queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::pop((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
             *)&di);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_a8);
    }
  }
  std::
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  ::~queue((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            *)&di);
  return;
}

Assistant:

void MemPass::DCEInst(Instruction* inst,
                      const std::function<void(Instruction*)>& call_back) {
  std::queue<Instruction*> deadInsts;
  deadInsts.push(inst);
  while (!deadInsts.empty()) {
    Instruction* di = deadInsts.front();
    // Don't delete labels
    if (di->opcode() == spv::Op::OpLabel) {
      deadInsts.pop();
      continue;
    }
    // Remember operands
    std::set<uint32_t> ids;
    di->ForEachInId([&ids](uint32_t* iid) { ids.insert(*iid); });
    uint32_t varId = 0;
    // Remember variable if dead load
    if (di->opcode() == spv::Op::OpLoad) (void)GetPtr(di, &varId);
    if (call_back) {
      call_back(di);
    }
    context()->KillInst(di);
    // For all operands with no remaining uses, add their instruction
    // to the dead instruction queue.
    for (auto id : ids)
      if (HasOnlyNamesAndDecorates(id)) {
        Instruction* odi = get_def_use_mgr()->GetDef(id);
        if (context()->IsCombinatorInstruction(odi)) deadInsts.push(odi);
      }
    // if a load was deleted and it was the variable's
    // last load, add all its stores to dead queue
    if (varId != 0 && !IsLiveVar(varId)) AddStores(varId, &deadInsts);
    deadInsts.pop();
  }
}